

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.h
# Opt level: O2

void __thiscall
TrodesMsg::TrodesMsg<char_const*,unsigned_int,std::__cxx11::string>
          (TrodesMsg *this,string *f,char *head,uint tail,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string local_48;
  
  TrodesMsg(this);
  std::__cxx11::string::string((string *)&local_48,(string *)f);
  std::__cxx11::string::string((string *)&bStack_68,(string *)tail_1);
  addcontents<char_const*,unsigned_int,std::__cxx11::string>(this,&local_48,head,tail,&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TrodesMsg(std::string f, H head, T... tail) : TrodesMsg(){
        addcontents(f, head, tail...);
    }